

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O2

UniquePtr<struct_stack_st_CRYPTO_BUFFER> __thiscall
bssl::SSL_parse_CA_list(bssl *this,SSL *ssl,uint8_t *out_alert,CBS *cbs)

{
  CRYPTO_BUFFER_POOL *pool;
  enable_if_t<_internal::StackTraits<stack_st_CRYPTO_BUFFER>::kIsConst,_bool> eVar1;
  char cVar2;
  int iVar3;
  _Head_base<0UL,_crypto_buffer_st_*,_false> _Var4;
  UniquePtr<struct_stack_st_CRYPTO_BUFFER> ret;
  UniquePtr<CRYPTO_BUFFER> buffer;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_60;
  SSL *local_58;
  CBS child;
  CBS distinguished_name;
  
  pool = ((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->pool;
  local_58 = ssl;
  ret._M_t.super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter,_true,_true>)
       OPENSSL_sk_new_null();
  if ((tuple<stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>)
      ret._M_t.super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl ==
      (_Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>)0x0) {
    *out_alert = 'P';
  }
  else {
    iVar3 = CBS_get_u16_length_prefixed(cbs,&child);
    if (iVar3 == 0) {
      *out_alert = '2';
      ERR_put_error(0x10,0,0xa2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                    ,0x184);
    }
    else {
      while (child.len != 0) {
        iVar3 = CBS_get_u16_length_prefixed(&child,&distinguished_name);
        if (iVar3 == 0) {
          *out_alert = '2';
          ERR_put_error(0x10,0,0x7b,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                        ,0x18c);
          goto LAB_0014d1d1;
        }
        _Var4._M_head_impl = CRYPTO_BUFFER_new_from_CBS(&distinguished_name,pool);
        buffer._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             _Var4._M_head_impl;
        if ((tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)_Var4._M_head_impl ==
            (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0) {
LAB_0014d14c:
          *out_alert = 'P';
          *(undefined8 *)this = 0;
          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&buffer);
          goto LAB_0014d1d5;
        }
        buffer._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0;
        local_60._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             _Var4._M_head_impl;
        eVar1 = PushToStack<stack_st_CRYPTO_BUFFER>
                          ((stack_st_CRYPTO_BUFFER *)
                           ret._M_t.
                           super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>.
                           _M_t.
                           super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>
                           .super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl,
                           &local_60);
        std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_60);
        if (!eVar1) goto LAB_0014d14c;
        std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&buffer);
      }
      cVar2 = (*((local_58->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->x509_method->
                check_CA_list)((stack_st_CRYPTO_BUFFER *)
                               ret._M_t.
                               super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                               ._M_t.
                               super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>
                               .super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl)
      ;
      if ((bool)cVar2) {
        *(__uniq_ptr_data<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter,_true,_true> *)this =
             ret._M_t.super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl;
        ret._M_t.super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl =
             (__uniq_ptr_data<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>)0x0;
        goto LAB_0014d1d5;
      }
      *out_alert = '2';
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                    ,0x19b);
    }
  }
LAB_0014d1d1:
  *(undefined8 *)this = 0;
LAB_0014d1d5:
  std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr(&ret);
  return (__uniq_ptr_data<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

UniquePtr<STACK_OF(CRYPTO_BUFFER)> SSL_parse_CA_list(SSL *ssl,
                                                     uint8_t *out_alert,
                                                     CBS *cbs) {
  CRYPTO_BUFFER_POOL *const pool = ssl->ctx->pool;

  UniquePtr<STACK_OF(CRYPTO_BUFFER)> ret(sk_CRYPTO_BUFFER_new_null());
  if (!ret) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return nullptr;
  }

  CBS child;
  if (!CBS_get_u16_length_prefixed(cbs, &child)) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_LENGTH_MISMATCH);
    return nullptr;
  }

  while (CBS_len(&child) > 0) {
    CBS distinguished_name;
    if (!CBS_get_u16_length_prefixed(&child, &distinguished_name)) {
      *out_alert = SSL_AD_DECODE_ERROR;
      OPENSSL_PUT_ERROR(SSL, SSL_R_CA_DN_TOO_LONG);
      return nullptr;
    }

    UniquePtr<CRYPTO_BUFFER> buffer(
        CRYPTO_BUFFER_new_from_CBS(&distinguished_name, pool));
    if (!buffer ||  //
        !PushToStack(ret.get(), std::move(buffer))) {
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return nullptr;
    }
  }

  if (!ssl->ctx->x509_method->check_CA_list(ret.get())) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return nullptr;
  }

  return ret;
}